

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

char ** kwsysSystem__ParseUnixCommand(char *command,int flags)

{
  char **ppcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ushort **ppuVar9;
  long lVar10;
  kwsysSystem_ptrdiff_t n_1;
  kwsysSystem_ptrdiff_t n;
  int failed;
  int in_double;
  int in_single;
  int in_escape;
  int in_argument;
  char *c;
  char **newCommand;
  char *buffer_end;
  char *buffer_begin;
  int buffer_size;
  char local_buffer [1024];
  char **local_130;
  char **pointer_end;
  char **pointer_begin;
  int pointers_size;
  char *local_pointers [32];
  int flags_local;
  char *command_local;
  
  pointer_begin._4_4_ = 0x20;
  local_130 = (char **)&stack0xfffffffffffffee8;
  buffer_begin._4_4_ = 0x400;
  newCommand = (char **)&stack0xfffffffffffffac8;
  c = (char *)0x0;
  bVar4 = false;
  bVar3 = false;
  bVar6 = false;
  bVar5 = false;
  bVar7 = false;
  _in_escape = (byte *)command;
  buffer_end = (char *)newCommand;
  pointer_end = local_130;
  local_pointers[0x1f]._4_4_ = flags;
  do {
    if (*_in_escape == 0) {
LAB_00160d84:
      if ((bVar4) &&
         (iVar8 = kwsysSystem__AppendArgument
                            ((char **)&stack0xfffffffffffffee8,&pointer_end,&local_130,
                             (int *)((long)&pointer_begin + 4),&stack0xfffffffffffffac8,&buffer_end,
                             (char **)&newCommand,(int *)((long)&buffer_begin + 4)), iVar8 == 0)) {
        bVar7 = true;
      }
      if (!bVar7) {
        c = (char *)malloc((((long)local_130 - (long)pointer_end >> 3) + 1) * 8);
      }
      if (c == (char *)0x0) {
        while (local_130 != pointer_end) {
          ppcVar1 = local_130 + -1;
          local_130 = local_130 + -1;
          free(*ppcVar1);
        }
      }
      else {
        lVar10 = (long)local_130 - (long)pointer_end >> 3;
        memcpy(c,pointer_end,lVar10 << 3);
        pcVar2 = c + lVar10 * 8;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
      }
      if (pointer_end != (char **)&stack0xfffffffffffffee8) {
        free(pointer_end);
      }
      if (buffer_end != &stack0xfffffffffffffac8) {
        free(buffer_end);
      }
      return (char **)c;
    }
    if (bVar3) {
      if (!bVar4) {
        bVar4 = true;
      }
      iVar8 = kwsysSystem__AppendByte
                        (&stack0xfffffffffffffac8,&buffer_end,(char **)&newCommand,
                         (int *)((long)&buffer_begin + 4),*_in_escape);
      if (iVar8 == 0) {
        bVar7 = true;
        goto LAB_00160d84;
      }
      bVar3 = false;
    }
    else if (*_in_escape == 0x5c) {
      bVar3 = true;
    }
    else if ((*_in_escape != 0x27) || (bVar5)) {
      if ((*_in_escape != 0x22) || (bVar6)) {
        ppuVar9 = __ctype_b_loc();
        if (((*ppuVar9)[(int)(uint)*_in_escape] & 0x2000) == 0) {
          if (!bVar4) {
            bVar4 = true;
          }
          iVar8 = kwsysSystem__AppendByte
                            (&stack0xfffffffffffffac8,&buffer_end,(char **)&newCommand,
                             (int *)((long)&buffer_begin + 4),*_in_escape);
          if (iVar8 == 0) {
            bVar7 = true;
            goto LAB_00160d84;
          }
        }
        else if (bVar4) {
          if ((bVar6) || (bVar5)) {
            iVar8 = kwsysSystem__AppendByte
                              (&stack0xfffffffffffffac8,&buffer_end,(char **)&newCommand,
                               (int *)((long)&buffer_begin + 4),*_in_escape);
            if (iVar8 == 0) {
              bVar7 = true;
              goto LAB_00160d84;
            }
          }
          else {
            iVar8 = kwsysSystem__AppendArgument
                              ((char **)&stack0xfffffffffffffee8,&pointer_end,&local_130,
                               (int *)((long)&pointer_begin + 4),&stack0xfffffffffffffac8,
                               &buffer_end,(char **)&newCommand,(int *)((long)&buffer_begin + 4));
            if (iVar8 == 0) {
              bVar7 = true;
              goto LAB_00160d84;
            }
            bVar4 = false;
          }
        }
      }
      else if (bVar5) {
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if (!bVar4) {
          bVar4 = true;
        }
      }
    }
    else if (bVar6) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
      if (!bVar4) {
        bVar4 = true;
      }
    }
    _in_escape = _in_escape + 1;
  } while( true );
}

Assistant:

static char** kwsysSystem__ParseUnixCommand(const char* command, int flags)
{
  /* Create a buffer for argument pointers during parsing.  */
  char* local_pointers[KWSYSPE_LOCAL_ARGS_COUNT];
  int pointers_size = KWSYSPE_LOCAL_ARGS_COUNT;
  char** pointer_begin = local_pointers;
  char** pointer_end = pointer_begin;

  /* Create a buffer for argument strings during parsing.  */
  char local_buffer[KWSYSPE_LOCAL_BYTE_COUNT];
  int buffer_size = KWSYSPE_LOCAL_BYTE_COUNT;
  char* buffer_begin = local_buffer;
  char* buffer_end = buffer_begin;

  /* Parse the command string.  Try to behave like a UNIX shell.  */
  char** newCommand = 0;
  const char* c = command;
  int in_argument = 0;
  int in_escape = 0;
  int in_single = 0;
  int in_double = 0;
  int failed = 0;
  for (; *c; ++c) {
    if (in_escape) {
      /* This character is escaped so do no special handling.  */
      if (!in_argument) {
        in_argument = 1;
      }
      if (!kwsysSystem__AppendByte(local_buffer, &buffer_begin, &buffer_end,
                                   &buffer_size, *c)) {
        failed = 1;
        break;
      }
      in_escape = 0;
    } else if (*c == '\\') {
      /* The next character should be escaped.  */
      in_escape = 1;
    } else if (*c == '\'' && !in_double) {
      /* Enter or exit single-quote state.  */
      if (in_single) {
        in_single = 0;
      } else {
        in_single = 1;
        if (!in_argument) {
          in_argument = 1;
        }
      }
    } else if (*c == '"' && !in_single) {
      /* Enter or exit double-quote state.  */
      if (in_double) {
        in_double = 0;
      } else {
        in_double = 1;
        if (!in_argument) {
          in_argument = 1;
        }
      }
    } else if (isspace((unsigned char)*c)) {
      if (in_argument) {
        if (in_single || in_double) {
          /* This space belongs to a quoted argument.  */
          if (!kwsysSystem__AppendByte(local_buffer, &buffer_begin,
                                       &buffer_end, &buffer_size, *c)) {
            failed = 1;
            break;
          }
        } else {
          /* This argument has been terminated by whitespace.  */
          if (!kwsysSystem__AppendArgument(
                local_pointers, &pointer_begin, &pointer_end, &pointers_size,
                local_buffer, &buffer_begin, &buffer_end, &buffer_size)) {
            failed = 1;
            break;
          }
          in_argument = 0;
        }
      }
    } else {
      /* This character belong to an argument.  */
      if (!in_argument) {
        in_argument = 1;
      }
      if (!kwsysSystem__AppendByte(local_buffer, &buffer_begin, &buffer_end,
                                   &buffer_size, *c)) {
        failed = 1;
        break;
      }
    }
  }

  /* Finish the last argument.  */
  if (in_argument) {
    if (!kwsysSystem__AppendArgument(
          local_pointers, &pointer_begin, &pointer_end, &pointers_size,
          local_buffer, &buffer_begin, &buffer_end, &buffer_size)) {
      failed = 1;
    }
  }

  /* If we still have memory allocate space for the new command
     buffer.  */
  if (!failed) {
    kwsysSystem_ptrdiff_t n = pointer_end - pointer_begin;
    newCommand = (char**)malloc((size_t)(n + 1) * sizeof(char*));
  }

  if (newCommand) {
    /* Copy the arguments into the new command buffer.  */
    kwsysSystem_ptrdiff_t n = pointer_end - pointer_begin;
    memcpy(newCommand, pointer_begin, sizeof(char*) * (size_t)(n));
    newCommand[n] = 0;
  } else {
    /* Free arguments already allocated.  */
    while (pointer_end != pointer_begin) {
      free(*(--pointer_end));
    }
  }

  /* Free temporary buffers.  */
  if (pointer_begin != local_pointers) {
    free(pointer_begin);
  }
  if (buffer_begin != local_buffer) {
    free(buffer_begin);
  }

  /* The flags argument is currently unused.  */
  (void)flags;

  /* Return the final command buffer.  */
  return newCommand;
}